

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGTextFragmentsBuilder::build(SVGTextFragmentsBuilder *this,SVGTextElement *textElement)

{
  float fVar1;
  SVGTextFragmentIterator SVar2;
  SVGTextFragment *pSVar3;
  bool bVar4;
  bool bVar5;
  SVGTextFragment *pSVar6;
  SVGTextPositioningElement *pSVar7;
  bool bVar8;
  int iVar9;
  SVGTextPositioningElement *pSVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  pointer pSVar13;
  byte bVar14;
  size_t *__x;
  SVGTextFragmentIterator end;
  SVGTextFragmentIterator begin;
  size_t endOffset;
  byte bVar15;
  SVGTextPositioningElement *node;
  SVGTextPosition *position;
  pointer pSVar16;
  SVGCharacterPositions *this_00;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_118;
  unsigned_long local_110;
  SVGTextPositioningElement *element;
  float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  SVGTextFragmentsBuilder *local_e8;
  pointer local_e0;
  size_t *local_d8;
  SVGCharacterPositions *local_d0;
  anon_class_32_4_9842c69d recordTextFragment;
  u32string_view wholeText;
  SVGTextFragment fragment;
  
  handleElement(this,&textElement->super_SVGTextPositioningElement);
  pSVar16 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar13 = (this->m_textPositions).
                 super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar13 != pSVar16;
      pSVar13 = pSVar13 + 1) {
    fillCharacterPositions(this,pSVar13);
  }
  wholeText._M_str = (this->m_text->_M_dataplus)._M_p;
  wholeText._M_len = this->m_text->_M_string_length;
  pSVar13 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar16 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_characterPositions;
  __x = &this->m_characterOffset;
  local_e8 = this;
  local_e0 = pSVar16;
  local_d8 = __x;
  local_d0 = this_00;
  do {
    if (pSVar13 == pSVar16) {
      SVar2._M_current =
           (this->m_fragments->
           super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>).
           _M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (this->m_fragments->
               super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      begin._M_current = SVar2._M_current;
      if (SVar2._M_current != pSVar3) {
        while (end._M_current = SVar2._M_current + 1, end._M_current != pSVar3) {
          pSVar6 = SVar2._M_current + 1;
          SVar2._M_current = end._M_current;
          if (pSVar6->startsNewTextChunk == true) {
            handleTextChunk(begin,end);
            begin._M_current = end._M_current;
          }
        }
        handleTextChunk(begin,end);
      }
      return;
    }
    iVar9 = (*pSVar13->node->_vptr_SVGNode[2])();
    if ((char)iVar9 == '\0') goto LAB_0011db9e;
    element = toSVGTextPositioningElement(&pSVar13->node->m_parentElement->super_SVGNode);
    SVGTextFragment::SVGTextFragment(&fragment,element);
    recordTextFragment.wholeText = &wholeText;
    recordTextFragment.element = &element;
    recordTextFragment.fragment = &fragment;
    recordTextFragment.this = this;
    if ((element->m_lengthAdjust).super_SVGProperty.field_0x9 == '\0') {
      bVar8 = SVGElement::hasAttribute((SVGElement *)element,TextLength);
    }
    else {
      bVar8 = false;
    }
    pSVar7 = element;
    local_118 = element->m_baseline_offset;
    node = element;
    while( true ) {
      node = (SVGTextPositioningElement *)
             (node->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.m_parentElement;
      iVar9 = (*(node->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[7])
                        (node);
      if ((char)iVar9 == '\0') break;
      pSVar10 = toSVGTextPositioningElement((SVGNode *)node);
      local_118 = local_118 + pSVar10->m_baseline_offset;
    }
    if (Baseline < pSVar7->m_alignment_baseline) {
      switch(pSVar7->m_alignment_baseline) {
      case BeforeEdge:
      case TextBeforeEdge:
        goto switchD_0011d923_caseD_2;
      case Middle:
        goto switchD_0011d923_caseD_4;
      case Central:
        goto switchD_0011d923_caseD_5;
      case AfterEdge:
      case TextAfterEdge:
      case Ideographic:
        goto switchD_0011d923_caseD_6;
      case Hanging:
        goto switchD_0011d923_caseD_a;
      case Mathematical:
        goto switchD_0011d923_caseD_b;
      }
      goto switchD_0011d8f7_caseD_0;
    }
    switch(pSVar7->m_dominant_baseline) {
    case Auto:
    case UseScript:
    case NoChange:
    case ResetSize:
    case Alphabetic:
      goto switchD_0011d8f7_caseD_0;
    case Ideographic:
    case TextAfterEdge:
switchD_0011d923_caseD_6:
      fVar18 = Font::descent(&pSVar7->m_font);
      goto LAB_0011d970;
    case Hanging:
switchD_0011d923_caseD_a:
      fVar18 = Font::ascent(&pSVar7->m_font);
      fVar18 = (fVar18 * -8.0) / 10.0;
      goto LAB_0011d9b7;
    case Mathematical:
switchD_0011d923_caseD_b:
      fVar18 = Font::ascent(&pSVar7->m_font);
      break;
    case Central:
switchD_0011d923_caseD_5:
      fVar18 = Font::ascent(&pSVar7->m_font);
      local_f8._0_4_ = fVar18;
      fVar18 = Font::descent(&pSVar7->m_font);
      fVar18 = fVar18 + (float)local_f8._0_4_;
      break;
    case Middle:
switchD_0011d923_caseD_4:
      fVar18 = Font::xHeight(&pSVar7->m_font);
      break;
    case TextBeforeEdge:
switchD_0011d923_caseD_2:
      fVar18 = Font::ascent(&pSVar7->m_font);
LAB_0011d970:
      local_118 = local_118 - fVar18;
      goto switchD_0011d8f7_caseD_0;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x2e,
                    "AlignmentBaseline lunasvg::resolveDominantBaseline(const SVGTextPositioningElement *)"
                   );
    }
    fVar18 = fVar18 * -0.5;
LAB_0011d9b7:
    local_118 = local_118 + fVar18;
switchD_0011d8f7_caseD_0:
    fVar18 = 0.0;
    bVar5 = false;
    endOffset = pSVar13->startOffset;
    local_110 = endOffset;
    for (; endOffset < pSVar13->endOffset; endOffset = endOffset + 1) {
      local_f8._0_4_ = fVar18;
      sVar11 = std::
               map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
               ::count(this_00,__x);
      if (sVar11 == 0) {
        fVar19 = 0.0;
        bVar15 = 0;
        fVar20 = 0.0;
        bVar14 = 0;
        fVar18 = 0.0;
      }
      else {
        pmVar12 = std::
                  map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
                  ::at(this_00,__x);
        if (((pmVar12->rotate).super__Optional_base<float,_true,_true>._M_payload.
             super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
          fVar18 = 0.0;
        }
        else {
          fVar18 = (pmVar12->rotate).super__Optional_base<float,_true,_true>._M_payload.
                   super__Optional_payload_base<float>._M_payload._M_value;
        }
        local_fc = (pmVar12->x).super__Optional_base<float,_true,_true>._M_payload.
                   super__Optional_payload_base<float>._M_payload._M_value;
        bVar14 = (pmVar12->x).super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_engaged;
        local_100 = (pmVar12->y).super__Optional_base<float,_true,_true>._M_payload.
                    super__Optional_payload_base<float>._M_payload._M_value;
        bVar15 = (pmVar12->y).super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_engaged;
        fVar19 = (pmVar12->dy).super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_payload._M_value;
        if (((pmVar12->dx).super__Optional_base<float,_true,_true>._M_payload.
             super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
          fVar20 = 0.0;
        }
        else {
          fVar20 = (pmVar12->dx).super__Optional_base<float,_true,_true>._M_payload.
                   super__Optional_payload_base<float>._M_payload._M_value;
        }
        if (((pmVar12->dy).super__Optional_base<float,_true,_true>._M_payload.
             super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
          fVar19 = 0.0;
        }
      }
      if ((bVar8 == false && (bVar14 & 1) == 0) &&
         (((fVar18 != 0.0 | bVar15 | -(fVar20 != 0.0 || fVar19 != 0.0)) & 1) == 0)) {
        if ((fVar18 != (float)local_f8._0_4_) || (NAN(fVar18) || NAN((float)local_f8._0_4_)))
        goto LAB_0011da68;
        bVar4 = false;
      }
      else {
LAB_0011da68:
        bVar4 = true;
        if (bVar5) {
          local_f8 = ZEXT416((uint)fVar18);
          build(lunasvg::SVGTextElement_const*)::$_0::operator()
                    (&recordTextFragment,local_110,endOffset);
          fVar18 = (float)local_f8._0_4_;
          local_110 = endOffset;
        }
      }
      if (((bVar14 | bVar15) & 1) == 0) {
        bVar17 = false;
      }
      else {
        bVar17 = endOffset == pSVar13->startOffset;
      }
      if ((bVar4 || bVar17 != false) || (!bVar5)) {
        fVar1 = local_fc;
        if ((bVar14 & 1) == 0) {
          fVar1 = local_e8->m_x;
        }
        fragment.x = fVar20 + fVar1;
        local_e8->m_x = fragment.x;
        fVar20 = local_100;
        if ((bVar15 & 1) == 0) {
          fVar20 = local_e8->m_y;
        }
        local_e8->m_y = fVar19 + fVar20;
        fragment.y = (fVar19 + fVar20) - local_118;
        bVar5 = true;
        fragment.angle = fVar18;
        fragment.startsNewTextChunk = bVar17;
      }
      *local_d8 = *local_d8 + 1;
      __x = local_d8;
      this_00 = local_d0;
    }
    build(lunasvg::SVGTextElement_const*)::$_0::operator()(&recordTextFragment,local_110,endOffset);
    this = local_e8;
    pSVar16 = local_e0;
LAB_0011db9e:
    pSVar13 = pSVar13 + 1;
  } while( true );
}

Assistant:

void SVGTextFragmentsBuilder::build(const SVGTextElement* textElement)
{
    handleElement(textElement);
    for(const auto& position : m_textPositions) {
        fillCharacterPositions(position);
    }

    std::u32string_view wholeText(m_text);
    for(const auto& textPosition : m_textPositions) {
        if(!textPosition.node->isTextNode())
            continue;
        auto element = toSVGTextPositioningElement(textPosition.node->parentElement());
        SVGTextFragment fragment(element);
        auto recordTextFragment = [&](auto startOffset, auto endOffset) {
            auto text = wholeText.substr(startOffset, endOffset - startOffset);
            fragment.offset = startOffset;
            fragment.length = text.length();
            fragment.width = element->font().measureText(text);
            m_fragments.push_back(fragment);
            m_x += fragment.width;
        };

        auto needsTextLengthSpacing = element->lengthAdjust() == LengthAdjust::Spacing && element->hasAttribute(PropertyID::TextLength);
        auto baselineOffset = calculateBaselineOffset(element);
        auto startOffset = textPosition.startOffset;
        auto textOffset = textPosition.startOffset;
        auto didStartTextFragment = false;
        auto lastAngle = 0.f;
        while(textOffset < textPosition.endOffset) {
            SVGCharacterPosition characterPosition;
            if(m_characterPositions.count(m_characterOffset) > 0) {
                characterPosition = m_characterPositions.at(m_characterOffset);
            }

            auto angle = characterPosition.rotate.value_or(0);
            auto dx = characterPosition.dx.value_or(0);
            auto dy = characterPosition.dy.value_or(0);

            auto shouldStartNewFragment = needsTextLengthSpacing || characterPosition.x || characterPosition.y || dx || dy || angle || angle != lastAngle;
            if(shouldStartNewFragment && didStartTextFragment) {
                recordTextFragment(startOffset, textOffset);
                startOffset = textOffset;
            }

            auto startsNewTextChunk = (characterPosition.x || characterPosition.y) && textOffset == textPosition.startOffset;
            if(startsNewTextChunk || shouldStartNewFragment || !didStartTextFragment) {
                m_x = dx + characterPosition.x.value_or(m_x);
                m_y = dy + characterPosition.y.value_or(m_y);
                fragment.x = m_x;
                fragment.y = m_y - baselineOffset;
                fragment.angle = angle;
                fragment.startsNewTextChunk = startsNewTextChunk;
                didStartTextFragment = true;
            }

            lastAngle = angle;
            ++textOffset;
            ++m_characterOffset;
        }

        recordTextFragment(startOffset, textOffset);
    }

    if(m_fragments.empty())
        return;
    auto it = m_fragments.begin();
    auto begin = m_fragments.begin();
    auto end = m_fragments.end();
    for(++it; it != end; ++it) {
        const SVGTextFragment& fragment = *it;
        if(!fragment.startsNewTextChunk)
            continue;
        handleTextChunk(begin, it);
        begin = it;
    }

    handleTextChunk(begin, it);
}